

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::reverseBits(APInt *this)

{
  uchar in [1];
  bool bVar1;
  anon_union_8_2_1313ab2f_for_U *paVar2;
  anon_union_8_2_1313ab2f_for_U __dest;
  byte bVar3;
  long lVar4;
  uint64_t val;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint uVar6;
  ulong *in_RSI;
  ulong __n;
  APInt AVar7;
  uchar out [4];
  uchar in_1 [4];
  undefined8 uStack_50;
  uint local_48;
  undefined4 uStack_44;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  uVar6 = (uint)in_RSI[1];
  switch(uVar6 << 0x1d | uVar6 - 8 >> 3) {
  case 0:
    val = (uint64_t)(byte)BitReverseTable256[(byte)*in_RSI];
    break;
  case 1:
    val = (uint64_t)
          CONCAT11(BitReverseTable256[*in_RSI & 0xff],BitReverseTable256[*in_RSI >> 8 & 0xff]);
    break;
  default:
    local_38 = uVar6;
    if (uVar6 < 0x41) {
      __dest.VAL = *in_RSI;
    }
    else {
      __n = (ulong)((uint)((ulong)uVar6 + 0x3f >> 3) & 0xfffffff8);
      uStack_50 = 0x141c6c;
      __dest.pVal = (uint64_t *)operator_new__(__n);
      uStack_50 = 0x141c7d;
      memcpy(__dest.pVal,(void *)*in_RSI,__n);
    }
    uStack_50 = 0x141c95;
    local_40 = __dest;
    APInt(this,uVar6,0,false);
    uVar6 = (uint)in_RSI[1];
    uStack_50 = 0x141ca3;
    bVar1 = operator==((APInt *)&local_40,0);
    if (!bVar1) {
      do {
        uStack_50 = 0x141cb9;
        operator<<=(this,1);
        uStack_50 = 0x141cc3;
        bVar1 = operator[]((APInt *)&local_40,0);
        if (this->BitWidth < 0x41) {
          bVar3 = -(char)this->BitWidth;
          (this->U).VAL = (((ulong)bVar1 | (this->U).VAL) << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
        }
        else {
          *(this->U).pVal = *(this->U).pVal | (ulong)bVar1;
        }
        uVar6 = uVar6 - 1;
        uStack_50 = 0x141cf4;
        lshrInPlace((APInt *)&local_40,1);
        uStack_50 = 0x141cfe;
        bVar1 = operator==((APInt *)&local_40,0);
      } while (!bVar1);
    }
    uStack_50 = 0x141d0c;
    operator<<=(this,uVar6);
    uVar5 = extraout_RDX_00;
    if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
      uStack_50 = 0x141d2a;
      operator_delete__(local_40.pVal);
      uVar5 = extraout_RDX_01;
    }
    goto LAB_00141c36;
  case 3:
    paVar2 = &local_40;
    local_40.VAL._0_4_ = (int)*in_RSI;
    lVar4 = 4;
    do {
      *(undefined1 *)((long)&uStack_50 + lVar4 + 7) = BitReverseTable256[*(byte *)paVar2];
      paVar2 = (anon_union_8_2_1313ab2f_for_U *)((long)paVar2 + 1);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    val = (uint64_t)local_48;
    break;
  case 7:
    paVar2 = &local_40;
    local_40.VAL = *in_RSI;
    lVar4 = 8;
    do {
      *(undefined1 *)((long)&uStack_50 + lVar4 + 7) = BitReverseTable256[*(byte *)paVar2];
      paVar2 = (anon_union_8_2_1313ab2f_for_U *)((long)paVar2 + 1);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    val = CONCAT44(uStack_44,local_48);
  }
  uStack_50 = 0x141c36;
  APInt(this,uVar6,val,false);
  uVar5 = extraout_RDX;
LAB_00141c36:
  AVar7._8_8_ = uVar5;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt APInt::reverseBits() const {
  switch (BitWidth) {
  case 64:
    return APInt(BitWidth, llvm::reverseBits<uint64_t>(U.VAL));
  case 32:
    return APInt(BitWidth, llvm::reverseBits<uint32_t>(U.VAL));
  case 16:
    return APInt(BitWidth, llvm::reverseBits<uint16_t>(U.VAL));
  case 8:
    return APInt(BitWidth, llvm::reverseBits<uint8_t>(U.VAL));
  default:
    break;
  }

  APInt Val(*this);
  APInt Reversed(BitWidth, 0);
  unsigned S = BitWidth;

  for (; Val != 0; Val.lshrInPlace(1)) {
    Reversed <<= 1;
    Reversed |= Val[0];
    --S;
  }

  Reversed <<= S;
  return Reversed;
}